

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

int stb_perfect_create(stb_perfect *p,uint *v,int n)

{
  short *psVar1;
  size_t __n;
  size_t __size;
  int iVar2;
  undefined1 *__ptr;
  undefined1 *__ptr_00;
  undefined1 *__ptr_01;
  ushort *puVar3;
  undefined1 *__ptr_02;
  long lVar4;
  stb_uint32 *psVar5;
  stb_uint16 *psVar6;
  bool bVar7;
  uint uVar8;
  ushort *puVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  undefined1 *puVar13;
  ushort uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  uint buffer3 [64];
  uint buffer5 [32];
  uint buffer4 [64];
  uint buffer2 [64];
  uint buffer1 [64];
  ushort local_4b8 [128];
  undefined1 local_3b8 [128];
  undefined1 local_338 [256];
  undefined1 local_238 [256];
  undefined1 local_138 [264];
  
  __n = (long)n * 4;
  uVar15 = (uint)__n;
  if ((int)uVar15 < 0x101) {
    __ptr = local_138;
    __ptr_00 = local_238;
  }
  else {
    __ptr = (undefined1 *)malloc((ulong)(uVar15 & 0x7ffffffc));
    __ptr_00 = (undefined1 *)malloc((ulong)(uVar15 & 0x7ffffffc));
  }
  if (n * 2 < 0x101) {
    __ptr_01 = local_338;
  }
  else {
    __ptr_01 = (undefined1 *)malloc((ulong)(uint)(n * 2));
  }
  if (0x8000 < n) {
    __assert_fail("n <= 32768",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                  ,0xde7,"int stb_perfect_create(stb_perfect *, unsigned int *, int)");
  }
  iVar2 = stb_log2_ceil(n);
  uVar22 = 1 << ((byte)iVar2 & 0x1f);
  p->large_bmap = (stb_uint16 *)0x0;
  uVar17 = (ulong)(uint)n;
  uVar20 = 8;
  uVar21 = 0;
  do {
    iVar2 = (int)uVar20;
    puVar3 = local_4b8;
    if (0x100 < iVar2 * 0x10) {
      puVar3 = (ushort *)malloc((ulong)(uint)(iVar2 * 0x10));
    }
    __size = (long)iVar2 * 2;
    __ptr_02 = local_3b8;
    uVar19 = (uint)__size;
    if (0x80 < (int)uVar19) {
      __ptr_02 = (undefined1 *)malloc((ulong)(uVar19 & 0x7ffffffe));
    }
    lVar4 = stb__perfect_rand_stb__rand * 0x7ff8a3ed + 0x2aa01d31;
    p->addend = (int)((ulong)lVar4 >> 0x10) + (int)lVar4 * 0x10000 ^ 0x31415926;
    stb__perfect_rand_stb__rand = lVar4 * 0x7ff8a3ed + 0x2aa01d31;
    uVar19 = (int)((ulong)stb__perfect_rand_stb__rand >> 0x10) +
             (int)stb__perfect_rand_stb__rand * 0x10000 & 0xfffffffeU ^ 0x31415927;
    p->multiplicand = uVar19;
    p->table_mask = uVar22 - 1;
    p->b_mask = iVar2 - 1U;
    psVar5 = (stb_uint32 *)malloc((long)(int)uVar22 << 2);
    p->table = psVar5;
    if (0 < iVar2) {
      puVar9 = puVar3 + 2;
      uVar11 = 0;
      do {
        puVar9[-1] = (ushort)uVar11;
        puVar9[-2] = 0;
        *puVar9 = 0;
        uVar11 = uVar11 + 1;
        puVar9 = puVar9 + 8;
      } while (uVar20 != uVar11);
    }
    if (0 < n) {
      uVar11 = 0;
      do {
        uVar10 = v[uVar11] * uVar19;
        uVar8 = v[uVar11] >> 0x10;
        uVar12 = (uVar10 >> 0x18) + uVar8 & iVar2 - 1U;
        psVar1 = (short *)((long)puVar3 + (ulong)((uVar12 & 0xffff) << 4));
        *psVar1 = *psVar1 + 1;
        *(short *)(__ptr_00 + uVar11 * 2) = (short)uVar12;
        *(ushort *)(__ptr + uVar11 * 2) = (ushort)(uVar8 + uVar10 >> 0xc) & (ushort)(uVar22 - 1);
        uVar11 = uVar11 + 1;
      } while (uVar17 != uVar11);
    }
    qsort(puVar3,(long)iVar2,0x10,stb__slot_compare);
    if (0 < iVar2) {
      uVar11 = 0;
      puVar9 = puVar3;
      puVar13 = __ptr_01;
      do {
        *(undefined1 **)(puVar9 + 4) = puVar13;
        puVar13 = puVar13 + (ulong)*puVar9 * 2;
        *puVar9 = 0;
        *(short *)(__ptr_02 + (ulong)puVar9[1] * 2) = (short)uVar11;
        uVar11 = uVar11 + 1;
        puVar9 = puVar9 + 8;
      } while (uVar20 != uVar11);
    }
    if (0 < n) {
      uVar11 = 0;
      do {
        uVar16 = (ulong)*(ushort *)(__ptr_02 + (ulong)*(ushort *)(__ptr_00 + uVar11 * 2) * 2);
        lVar4 = *(long *)(puVar3 + uVar16 * 8 + 4);
        uVar14 = puVar3[uVar16 * 8];
        puVar3[uVar16 * 8] = uVar14 + 1;
        *(short *)(lVar4 + (ulong)uVar14 * 2) = (short)uVar11;
        uVar11 = uVar11 + 1;
      } while (uVar17 != uVar11);
    }
    if (__ptr_02 != local_3b8) {
      free(__ptr_02);
    }
    if (0 < iVar2) {
      uVar11 = 0;
      do {
        if ((ulong)puVar3[uVar11 * 8] != 0) {
          uVar16 = 0;
          do {
            if (*(ushort *)
                 (__ptr_00 + (ulong)*(ushort *)(*(long *)(puVar3 + uVar11 * 8 + 4) + uVar16 * 2) * 2
                 ) != puVar3[uVar11 * 8 + 1]) {
              __assert_fail("bs[bcount[i].entries[j]] == bcount[i].b",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                            ,0xe11,"int stb_perfect_create(stb_perfect *, unsigned int *, int)");
            }
            uVar16 = uVar16 + 1;
          } while (puVar3[uVar11 * 8] != uVar16);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar20);
    }
    memset(p->table,0,(long)(int)uVar22 << 2);
    if (0 < iVar2) {
      uVar11 = 0;
      do {
        uVar16 = (ulong)puVar3[uVar11 * 8];
        if (1 < uVar16) {
          psVar5 = p->table;
          lVar4 = *(long *)(puVar3 + uVar11 * 8 + 4);
          uVar18 = 0;
          bVar7 = false;
          do {
            if (psVar5[*(ushort *)(__ptr + (ulong)*(ushort *)(lVar4 + uVar18 * 2) * 2)] != 0) {
              bVar7 = true;
            }
            psVar5[*(ushort *)(__ptr + (ulong)*(ushort *)(lVar4 + uVar18 * 2) * 2)] = 1;
            uVar18 = uVar18 + 1;
          } while (uVar16 != uVar18);
          psVar5 = p->table;
          lVar4 = *(long *)(puVar3 + uVar11 * 8 + 4);
          uVar18 = 0;
          do {
            psVar5[*(ushort *)(__ptr + (ulong)*(ushort *)(lVar4 + uVar18 * 2) * 2)] = 0;
            uVar18 = uVar18 + 1;
          } while (uVar16 != uVar18);
          if (bVar7) goto LAB_001846a9;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar20);
    }
    if (iVar2 < 1) {
      uVar16 = 0;
    }
    else {
      uVar11 = 0;
      do {
        uVar14 = puVar3[uVar11 * 8];
        if (uVar14 != 0) {
          if (0 < (int)uVar22) {
            uVar19 = 0;
LAB_001845bc:
            uVar16 = 0;
            do {
              if (p->table[(*(ushort *)
                             (__ptr + (ulong)*(ushort *)
                                              (*(long *)(puVar3 + uVar11 * 8 + 4) + uVar16 * 2) * 2)
                           ^ uVar19) & p->table_mask] != 0) goto LAB_001845e2;
              uVar16 = uVar16 + 1;
            } while (uVar14 != uVar16);
            uVar16 = (ulong)(uint)uVar14;
LAB_001845e2:
            if ((uint)uVar16 != (uint)uVar14) goto code_r0x001845ec;
            puVar3[uVar11 * 8 + 2] = (ushort)uVar19;
            lVar4 = *(long *)(puVar3 + uVar11 * 8 + 4);
            psVar5 = p->table;
            uVar16 = 0;
            do {
              psVar5[(*(ushort *)(__ptr + (ulong)*(ushort *)(lVar4 + uVar16 * 2) * 2) ^ uVar19) &
                     p->table_mask] = 1;
              uVar16 = uVar16 + 1;
              uVar8 = uVar19;
            } while (uVar14 != uVar16);
            goto LAB_00184635;
          }
          uVar8 = 0;
LAB_00184635:
          uVar16 = uVar11;
          if (uVar8 == uVar22) break;
        }
        uVar11 = uVar11 + 1;
        uVar16 = uVar20;
      } while (uVar11 != uVar20);
    }
    if ((int)uVar16 == iVar2) {
      if ((iVar2 < 0x11) && ((int)uVar22 < 0x101)) {
        p->large_bmap = (stb_uint16 *)0x0;
        if (0 < iVar2) {
          lVar4 = 0;
          do {
            p->small_bmap[*(ushort *)((long)puVar3 + lVar4 + 2)] =
                 *(stb_uint8 *)((long)puVar3 + lVar4 + 4);
            lVar4 = lVar4 + 0x10;
          } while (uVar20 << 4 != lVar4);
        }
      }
      else {
        psVar6 = (stb_uint16 *)malloc(__size);
        p->large_bmap = psVar6;
        if (0 < iVar2) {
          lVar4 = 0;
          do {
            psVar6[*(ushort *)((long)puVar3 + lVar4 + 2)] =
                 *(stb_uint16 *)((long)puVar3 + lVar4 + 4);
            lVar4 = lVar4 + 0x10;
          } while (uVar20 << 4 != lVar4);
        }
      }
      if (0 < (int)uVar22) {
        psVar5 = p->table;
        uVar11 = 0;
        do {
          psVar5[uVar11] = *v;
          uVar11 = uVar11 + 1;
        } while (uVar22 != uVar11);
      }
      if (0 < n) {
        psVar6 = p->large_bmap;
        psVar5 = p->table;
        uVar11 = 0;
        do {
          if (psVar6 == (stb_uint16 *)0x0) {
            uVar14 = (ushort)p->small_bmap[*(ushort *)(__ptr_00 + uVar11 * 2)];
          }
          else {
            uVar14 = psVar6[*(ushort *)(__ptr_00 + uVar11 * 2)];
          }
          psVar5[*(ushort *)(__ptr + uVar11 * 2) ^ uVar14] = v[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar17 != uVar11);
      }
      if (0 < n) {
        uVar11 = 0;
        do {
          iVar2 = stb_perfect_hash(p,v[uVar11]);
          if (iVar2 < 0) {
            __assert_fail("stb_perfect_hash(p, v[i]) >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                          ,0xe56,"int stb_perfect_create(stb_perfect *, unsigned int *, int)");
          }
          uVar11 = uVar11 + 1;
        } while (uVar17 != uVar11);
      }
      if (puVar3 != local_4b8) {
        free(puVar3);
      }
      bVar7 = false;
    }
    else {
LAB_001846a9:
      free(p->table);
      p->table = (stb_uint32 *)0x0;
      if (puVar3 != local_4b8) {
        free(puVar3);
      }
      uVar19 = uVar21 + 1;
      bVar7 = ((int)uVar22 < n * 4 && 6 < (int)uVar21) && (uVar19 & 3) == 0;
      uVar20 = (ulong)(uint)((iVar2 << (iVar2 < (int)uVar22 && 2 < (int)uVar21)) << bVar7);
      uVar22 = uVar22 << bVar7;
      bVar7 = true;
      uVar21 = uVar19;
      if (uVar19 == 6) {
        puVar3 = local_4b8;
        if (0x100 < (int)uVar15) {
          puVar3 = (ushort *)malloc((ulong)(uVar15 & 0x7ffffffc));
        }
        memcpy(puVar3,v,__n);
        stb__intcmpoffset = 0;
        qsort(puVar3,(long)n,4,stb__intcmp);
        if (1 < n) {
          uVar11 = 1;
          do {
            if (*(int *)(puVar3 + uVar11 * 2) == *(int *)(puVar3 + uVar11 * 2 + -2)) {
              uVar22 = 0;
            }
            uVar11 = uVar11 + 1;
          } while (uVar17 != uVar11);
        }
        if (puVar3 != local_4b8) {
          free(puVar3);
        }
        bVar7 = uVar22 != 0;
        if (!bVar7) {
          uVar21 = 6;
        }
      }
    }
    if (!bVar7) {
      if (stb_perfect_hash_max_failures < (int)uVar21) {
        stb_perfect_hash_max_failures = uVar21;
      }
      if (__ptr != local_138) {
        free(__ptr);
      }
      if (__ptr_00 != local_238) {
        free(__ptr_00);
      }
      if (__ptr_01 != local_338) {
        free(__ptr_01);
      }
      return uVar22;
    }
  } while( true );
code_r0x001845ec:
  uVar19 = uVar19 + 1;
  uVar8 = uVar22;
  if (uVar19 == uVar22) goto LAB_00184635;
  goto LAB_001845bc;
}

Assistant:

int stb_perfect_create(stb_perfect *p, unsigned int *v, int n)
{
   unsigned int buffer1[64], buffer2[64], buffer3[64], buffer4[64], buffer5[32];
   unsigned short *as = (unsigned short *) stb_temp(buffer1, sizeof(*v)*n);
   unsigned short *bs = (unsigned short *) stb_temp(buffer2, sizeof(*v)*n);
   unsigned short *entries = (unsigned short *) stb_temp(buffer4, sizeof(*entries) * n);
   int size = 1 << stb_log2_ceil(n), bsize=8;
   int failure = 0,i,j,k;

   assert(n <= 32768);
   p->large_bmap = NULL;

   for(;;) {
      stb__slot *bcount = (stb__slot *) stb_temp(buffer3, sizeof(*bcount) * bsize);
      unsigned short *bloc = (unsigned short *) stb_temp(buffer5, sizeof(*bloc) * bsize);
      unsigned short *e;
      int bad=0;

      p->addend = stb__perfect_rand();
      p->multiplicand = stb__perfect_rand() | 1;
      p->table_mask = size-1;
      p->b_mask = bsize-1;
      p->table = (stb_uint32 *) malloc(size * sizeof(*p->table));

      for (i=0; i < bsize; ++i) {
         bcount[i].b     = i;
         bcount[i].count = 0;
         bcount[i].map   = 0;
      }
      for (i=0; i < n; ++i) {
         stb__perfect_prehash(p, v[i], as+i, bs+i);
         ++bcount[bs[i]].count;
      }
      qsort(bcount, bsize, sizeof(*bcount), stb__slot_compare);
      e = entries; // now setup up their entries index
      for (i=0; i < bsize; ++i) {
         bcount[i].entries = e;
         e += bcount[i].count;
         bcount[i].count = 0;
         bloc[bcount[i].b] = i;
      }
      // now fill them out
      for (i=0; i < n; ++i) {
         int b = bs[i];
         int w = bloc[b];
         bcount[w].entries[bcount[w].count++] = i;
      }
      stb_tempfree(buffer5,bloc);
      // verify
      for (i=0; i < bsize; ++i)
         for (j=0; j < bcount[i].count; ++j)
            assert(bs[bcount[i].entries[j]] == bcount[i].b);
      memset(p->table, 0, size*sizeof(*p->table));

      // check if any b has duplicate a
      for (i=0; i < bsize; ++i) {
         if (bcount[i].count > 1) {
            for (j=0; j < bcount[i].count; ++j) {
               if (p->table[as[bcount[i].entries[j]]])
                  bad = 1;
               p->table[as[bcount[i].entries[j]]] = 1;
            }
            for (j=0; j < bcount[i].count; ++j) {
               p->table[as[bcount[i].entries[j]]] = 0;
            }
            if (bad) break;
         }
      }

      if (!bad) {
         // go through the bs and populate the table, first fit
         for (i=0; i < bsize; ++i) {
            if (bcount[i].count) {
               // go through the candidate table[b] values
               for (j=0; j < size; ++j) {
                  // go through the a values and see if they fit
                  for (k=0; k < bcount[i].count; ++k) {
                     int a = as[bcount[i].entries[k]];
                     if (p->table[(a^j)&p->table_mask]) {
                        break; // fails
                     }
                  }
                  // if succeeded, accept
                  if (k == bcount[i].count) {
                     bcount[i].map = j;
                     for (k=0; k < bcount[i].count; ++k) {
                        int a = as[bcount[i].entries[k]];
                        p->table[(a^j)&p->table_mask] = 1;
                     }
                     break;
                  }
               }
               if (j == size)
                  break; // no match for i'th entry, so break out in failure
            }
         }
         if (i == bsize) {
            // success... fill out map
            if (bsize <= 16 && size <= 256) {
               p->large_bmap = NULL;
               for (i=0; i < bsize; ++i)
                  p->small_bmap[bcount[i].b] = (stb_uint8) bcount[i].map;
            } else {
               p->large_bmap = (unsigned short *) malloc(sizeof(*p->large_bmap) * bsize);
               for (i=0; i < bsize; ++i)
                  p->large_bmap[bcount[i].b] = bcount[i].map;
            }

            // initialize table to v[0], so empty slots will fail
            for (i=0; i < size; ++i)
               p->table[i] = v[0];

            for (i=0; i < n; ++i)
               if (p->large_bmap)
                  p->table[as[i] ^ p->large_bmap[bs[i]]] = v[i];
               else
                  p->table[as[i] ^ p->small_bmap[bs[i]]] = v[i];

            // and now validate that none of them collided
            for (i=0; i < n; ++i)
               assert(stb_perfect_hash(p, v[i]) >= 0);

            stb_tempfree(buffer3, bcount);
            break;
         }
      }
      free(p->table);
      p->table = NULL;
      stb_tempfree(buffer3, bcount);

      ++failure;
      if (failure >= 4 && bsize < size) bsize *= 2;
      if (failure >= 8 && (failure & 3) == 0 && size < 4*n) {
         size *= 2;
         bsize *= 2;
      }
      if (failure == 6) {
         // make sure the input data is unique, so we don't infinite loop
         unsigned int *data = (unsigned int *) stb_temp(buffer3, n * sizeof(*data));
         memcpy(data, v, sizeof(*data) * n);
         qsort(data, n, sizeof(*data), stb_intcmp(0));
         for (i=1; i < n; ++i) {
            if (data[i] == data[i-1])
               size = 0; // size is return value, so 0 it
         }
         stb_tempfree(buffer3, data);
         if (!size) break;
      }
   }

   if (failure > stb_perfect_hash_max_failures)
      stb_perfect_hash_max_failures = failure;

   stb_tempfree(buffer1, as);
   stb_tempfree(buffer2, bs);
   stb_tempfree(buffer4, entries);

   return size;
}